

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t detect_form(archive_read *a,wchar_t *is_form_d)

{
  wchar_t wVar1;
  int iVar2;
  bool bVar3;
  wchar_t local_58;
  wchar_t keywords;
  wchar_t last_is_path;
  wchar_t form_D;
  wchar_t multiline;
  wchar_t entry_cnt;
  ssize_t nl;
  ssize_t len;
  ssize_t ravail;
  ssize_t avail;
  char *p;
  wchar_t *is_form_d_local;
  archive_read *a_local;
  
  form_D = L'\0';
  last_is_path = L'\0';
  keywords = L'\0';
  if (is_form_d != (wchar_t *)0x0) {
    *is_form_d = L'\0';
  }
  p = (char *)is_form_d;
  is_form_d_local = (wchar_t *)a;
  avail = (ssize_t)__archive_read_ahead(a,1,&ravail);
  if ((void *)avail == (void *)0x0) {
    return L'\xffffffff';
  }
  len = ravail;
  do {
    while( true ) {
      while( true ) {
        nl = next_line((archive_read *)is_form_d_local,(char **)&avail,&ravail,&len,
                       (ssize_t *)&multiline);
        if ((nl < 1) || (_multiline == 0)) goto LAB_00ca2bfd;
        if (last_is_path == L'\0') break;
        wVar1 = bid_keyword_list((char *)avail,nl,L'\0',L'\0');
        if (wVar1 < L'\x01') goto LAB_00ca2bfd;
        if (*(char *)(avail + (nl - _multiline) + -1) != '\\') {
          if ((last_is_path == L'\x01') && (form_D = form_D + L'\x01', L'\x02' < form_D))
          goto LAB_00ca2bfd;
          last_is_path = L'\0';
        }
        avail = nl + avail;
        ravail = ravail - nl;
      }
      while( true ) {
        bVar3 = false;
        if ((0 < nl) && (bVar3 = true, *(char *)avail != ' ')) {
          bVar3 = *(char *)avail == '\t';
        }
        if (!bVar3) break;
        avail = avail + 1;
        ravail = ravail + -1;
        nl = nl + -1;
      }
      if (((*(char *)avail != '#') && (*(char *)avail != '\n')) && (*(char *)avail != '\r')) break;
      avail = nl + avail;
      ravail = ravail - nl;
    }
    if (*(char *)avail == '/') {
      if ((nl < 5) || (iVar2 = strncmp((char *)avail,"/set",4), iVar2 != 0)) {
        if ((nl < 7) ||
           ((iVar2 = strncmp((char *)avail,"/unset",6), iVar2 != 0 ||
            (wVar1 = bid_keyword_list((char *)(avail + 6),nl + -6,L'\x01',L'\0'), wVar1 < L'\x01')))
           ) goto LAB_00ca2bfd;
        if (*(char *)(avail + (nl - _multiline) + -1) == '\\') {
          last_is_path = L'\x02';
        }
      }
      else {
        wVar1 = bid_keyword_list((char *)(avail + 4),nl + -4,L'\0',L'\0');
        if (wVar1 < L'\x01') goto LAB_00ca2bfd;
        if (*(char *)(avail + (nl - _multiline) + -1) == '\\') {
          last_is_path = L'\x02';
        }
      }
    }
    else {
      wVar1 = bid_entry((char *)avail,nl,_multiline,&local_58);
      if (wVar1 < L'\0') {
LAB_00ca2bfd:
        if ((form_D < L'\x03') && ((form_D < L'\x01' || (nl != 0)))) {
          return L'\0';
        }
        if ((p != (char *)0x0) && (keywords == L'\x01')) {
          p[0] = '\x01';
          p[1] = '\0';
          p[2] = '\0';
          p[3] = '\0';
        }
        return L' ';
      }
      if (keywords == L'\0') {
        if (local_58 == L'\0') {
          if (L'\0' < wVar1) {
            keywords = L'\xffffffff';
          }
        }
        else {
          keywords = L'\x01';
        }
      }
      else if (((keywords == L'\x01') && (local_58 == L'\0')) && (L'\0' < wVar1)) goto LAB_00ca2bfd;
      if ((local_58 == L'\0') && (*(char *)(avail + (nl - _multiline) + -1) == '\\')) {
        last_is_path = L'\x01';
      }
      else {
        form_D = form_D + L'\x01';
        if (L'\x02' < form_D) goto LAB_00ca2bfd;
      }
    }
    avail = nl + avail;
    ravail = ravail - nl;
  } while( true );
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}